

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionObject.cpp
# Opt level: O1

void __thiscall
APhyBullet::BulletCollisionObject::setHandleCollisionFlagValue
          (BulletCollisionObject *this,CollisionFlags flag,bool value)

{
  CollisionFlags CVar1;
  undefined3 in_register_00000011;
  CollisionFlags CVar2;
  
  CVar1 = this->handle->m_collisionFlags;
  CVar2 = ~flag & CVar1;
  if (CONCAT31(in_register_00000011,value) != 0) {
    CVar2 = CVar1 | flag;
  }
  this->handle->m_collisionFlags = CVar2;
  return;
}

Assistant:

void BulletCollisionObject::setHandleCollisionFlagValue(btCollisionObject::CollisionFlags flag, bool value)
{
    auto flags = handle->getCollisionFlags();
    if(value)
        flags |= flag;
    else
        flags &= ~flag;
    handle->setCollisionFlags(flags);
}